

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_reader.cpp
# Opt level: O3

Value * __thiscall
duckdb::MultiFileOptions::GetHivePartitionValue
          (Value *__return_storage_ptr__,MultiFileOptions *this,string *value,string *key,
          ClientContext *context)

{
  const_iterator cVar1;
  LogicalType local_40;
  
  cVar1 = ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->hive_types_schema)._M_h,key);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
      ._M_cur == (__node_type *)0x0) {
    LogicalType::LogicalType(&local_40,VARCHAR);
    HivePartitioning::GetValue
              (__return_storage_ptr__,context,(string *)key,(string *)value,&local_40);
    LogicalType::~LogicalType(&local_40);
  }
  else {
    HivePartitioning::GetValue
              (__return_storage_ptr__,context,(string *)key,(string *)value,
               (LogicalType *)
               ((long)cVar1.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                      ._M_cur + 0x28));
  }
  return __return_storage_ptr__;
}

Assistant:

Value MultiFileOptions::GetHivePartitionValue(const string &value, const string &key, ClientContext &context) const {
	auto it = hive_types_schema.find(key);
	if (it == hive_types_schema.end()) {
		return HivePartitioning::GetValue(context, key, value, LogicalType::VARCHAR);
	}
	return HivePartitioning::GetValue(context, key, value, it->second);
}